

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinner.h
# Opt level: O0

void __thiscall miniros::AsyncSpinner::~AsyncSpinner(AsyncSpinner *this)

{
  std::shared_ptr<miniros::AsyncSpinnerImpl>::~shared_ptr
            ((shared_ptr<miniros::AsyncSpinnerImpl> *)0x4be10e);
  return;
}

Assistant:

class MINIROS_DECL AsyncSpinner
{
public:
  /**
   * \brief Simple constructor.  Uses the global callback queue
   * \param thread_count The number of threads to use.  A value of 0 means to use the number of processor cores
   */
  AsyncSpinner(uint32_t thread_count);

  /**
   * \brief Constructor with custom callback queue
   * \param thread_count The number of threads to use.  A value of 0 means to use the number of processor cores
   * \param queue The callback queue to operate on.  A null value means to use the global queue
   */
  AsyncSpinner(uint32_t thread_count, CallbackQueue* queue);



  /**
   * \brief Check if the spinner can be started. The spinner shouldn't be started if
   * another single-threaded spinner is already operating on the callback queue.
   *
   * This function is not necessary anymore. start() will always try to start spinning
   * and throw a std::runtime_error if it failed.
   */
  // TODO: deprecate in L-turtle
  bool canStart();
  /**
   * \brief Start this spinner spinning asynchronously
   */
  void start();
  /**
   * \brief Stop this spinner from running
   */
  void stop();

private:
  AsyncSpinnerImplPtr impl_;
}